

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenetic.c
# Opt level: O0

int array_hash(char *array,int modulus)

{
  int local_2c;
  int *intarray;
  int local_18;
  int i;
  int val;
  int modulus_local;
  char *array_local;
  
  local_18 = 0;
  for (intarray._4_4_ = 0; intarray._4_4_ < numvars; intarray._4_4_ = intarray._4_4_ + 1) {
    local_18 = local_18 * 0x3e5 + *(int *)(array + (long)intarray._4_4_ * 4);
  }
  if (local_18 < 0) {
    local_2c = -local_18;
  }
  else {
    local_2c = local_18;
  }
  return local_2c % modulus;
}

Assistant:

static int
array_hash(
  const char * array,
  int  modulus)
{
    int val = 0;
    int i;
    int *intarray;

    intarray = (int *) array;

    for (i = 0; i < numvars; i++) {
        val = val * 997 + intarray[i];
    }

    return ((val < 0) ? -val : val) % modulus;

}